

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::NumberFormat::format
          (NumberFormat *this,Formattable *obj,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  LocalPointer<icu_63::NumberFormat> s1;
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  Type TVar4;
  uint uVar5;
  Formattable *this_00;
  char16_t *s2;
  undefined4 extraout_var;
  NumberFormat *pNVar6;
  undefined4 extraout_var_00;
  DecimalQuantity *pDVar7;
  int64_t iVar8;
  double dVar9;
  LocalPointerBase<icu_63::NumberFormat> local_78;
  LocalPointer<icu_63::NumberFormat> cloneFmt;
  UChar *iso;
  Formattable *n;
  ArgExtractor arg;
  UErrorCode *status_local;
  FieldPosition *pos_local;
  UnicodeString *appendTo_local;
  Formattable *obj_local;
  NumberFormat *this_local;
  
  arg._16_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return appendTo;
  }
  ArgExtractor::ArgExtractor((ArgExtractor *)&n,this,obj,(UErrorCode *)arg._16_8_);
  this_00 = ArgExtractor::number((ArgExtractor *)&n);
  cloneFmt.super_LocalPointerBase<icu_63::NumberFormat>.ptr =
       (LocalPointerBase<icu_63::NumberFormat>)ArgExtractor::iso((ArgExtractor *)&n);
  UVar1 = ArgExtractor::wasCurrency((ArgExtractor *)&n);
  s1.super_LocalPointerBase<icu_63::NumberFormat>.ptr =
       cloneFmt.super_LocalPointerBase<icu_63::NumberFormat>.ptr;
  if (UVar1 != '\0') {
    s2 = getCurrency(this);
    iVar2 = u_strcmp_63((UChar *)s1.super_LocalPointerBase<icu_63::NumberFormat>.ptr,s2);
    if (iVar2 != 0) {
      iVar3 = (*(this->super_Format).super_UObject._vptr_UObject[4])();
      LocalPointer<icu_63::NumberFormat>::LocalPointer
                ((LocalPointer<icu_63::NumberFormat> *)&local_78,
                 (NumberFormat *)CONCAT44(extraout_var,iVar3));
      pNVar6 = LocalPointerBase<icu_63::NumberFormat>::operator->(&local_78);
      (*(pNVar6->super_Format).super_UObject._vptr_UObject[0x1f])
                (pNVar6,cloneFmt.super_LocalPointerBase<icu_63::NumberFormat>.ptr,arg._16_8_);
      pNVar6 = LocalPointerBase<icu_63::NumberFormat>::operator->(&local_78);
      iVar3 = (*(pNVar6->super_Format).super_UObject._vptr_UObject[5])
                        (pNVar6,this_00,appendTo,pos,arg._16_8_);
      this_local = (NumberFormat *)CONCAT44(extraout_var_00,iVar3);
      LocalPointer<icu_63::NumberFormat>::~LocalPointer
                ((LocalPointer<icu_63::NumberFormat> *)&local_78);
      goto LAB_0026f11d;
    }
  }
  UVar1 = Formattable::isNumeric(this_00);
  this_local = (NumberFormat *)appendTo;
  if ((UVar1 == '\0') ||
     (pDVar7 = Formattable::getDecimalQuantity(this_00), pDVar7 == (DecimalQuantity *)0x0)) {
    TVar4 = Formattable::getType(this_00);
    if (TVar4 == kDouble) {
      dVar9 = Formattable::getDouble(this_00);
      (*(this->super_Format).super_UObject._vptr_UObject[9])(dVar9,this,appendTo,pos,arg._16_8_);
    }
    else if (TVar4 == kLong) {
      uVar5 = Formattable::getLong(this_00);
      (*(this->super_Format).super_UObject._vptr_UObject[0xc])
                (this,(ulong)uVar5,appendTo,pos,arg._16_8_);
    }
    else if (TVar4 == kInt64) {
      iVar8 = Formattable::getInt64(this_00);
      (*(this->super_Format).super_UObject._vptr_UObject[0xf])(this,iVar8,appendTo,pos,arg._16_8_);
    }
    else {
      *(undefined4 *)arg._16_8_ = 3;
    }
  }
  else {
    pDVar7 = Formattable::getDecimalQuantity(this_00);
    (*(this->super_Format).super_UObject._vptr_UObject[0x13])(this,pDVar7,appendTo,pos,arg._16_8_);
  }
LAB_0026f11d:
  ArgExtractor::~ArgExtractor((ArgExtractor *)&n);
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
NumberFormat::format(const Formattable& obj,
                        UnicodeString& appendTo,
                        FieldPosition& pos,
                        UErrorCode& status) const
{
    if (U_FAILURE(status)) return appendTo;

    ArgExtractor arg(*this, obj, status);
    const Formattable *n = arg.number();
    const UChar *iso = arg.iso();

    if(arg.wasCurrency() && u_strcmp(iso, getCurrency())) {
      // trying to format a different currency.
      // Right now, we clone.
      LocalPointer<NumberFormat> cloneFmt((NumberFormat*)this->clone());
      cloneFmt->setCurrency(iso, status);
      // next line should NOT recurse, because n is numeric whereas obj was a wrapper around currency amount.
      return cloneFmt->format(*n, appendTo, pos, status);
    }

    if (n->isNumeric() && n->getDecimalQuantity() != NULL) {
        // Decimal Number.  We will have a DigitList available if the value was
        //   set to a decimal number, or if the value originated with a parse.
        //
        // The default implementation for formatting a DigitList converts it
        // to a double, and formats that, allowing formatting classes that don't
        // know about DigitList to continue to operate as they had.
        //
        // DecimalFormat overrides the DigitList formatting functions.
        format(*n->getDecimalQuantity(), appendTo, pos, status);
    } else {
        switch (n->getType()) {
        case Formattable::kDouble:
            format(n->getDouble(), appendTo, pos, status);
            break;
        case Formattable::kLong:
            format(n->getLong(), appendTo, pos, status);
            break;
        case Formattable::kInt64:
            format(n->getInt64(), appendTo, pos, status);
            break;
        default:
            status = U_INVALID_FORMAT_ERROR;
            break;
        }
    }

    return appendTo;
}